

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O3

void __thiscall
PreciseMeasurement_helpConstructors_Test::TestBody(PreciseMeasurement_helpConstructors_Test *this)

{
  precise_unit *desired_units;
  precise_unit *desired_units_00;
  double dVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  double dVar3;
  bool bVar4;
  unit_data uVar5;
  char *pcVar6;
  char *in_R9;
  uint uVar7;
  pointer *__ptr_1;
  pointer *__ptr;
  precise_unit pVar8;
  AssertionResult gtest_ar;
  precise_measurement d2;
  precise_measurement d1;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  AssertHelper local_d0;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined8 uStack_68;
  undefined1 local_58 [16];
  undefined8 uStack_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_58._0_8_ = &DAT_4046800000000000;
  local_58._8_8_ = 0x3ff0000000000000;
  uStack_48 = (double)1;
  local_78._0_8_ = &DAT_4053c00000000000;
  local_78._8_8_ = 0x3ff0000000000000;
  uStack_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)1;
  uVar5 = units::detail::unit_data::operator*((unit_data *)&uStack_48,(unit_data *)&uStack_68);
  uVar7 = uStack_68._4_4_ | uStack_48._4_4_;
  local_c8 = (undefined1  [8])&DAT_40abc60000000000;
  local_e0 = (undefined1  [8])&DAT_40abc60000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_a8,"area.value()","45.0 * 79",(double *)local_c8,(double *)local_e0);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x220,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_a0,pbStack_a0);
  }
  local_a8 = (undefined1  [8])&DAT_3ff0000000000000;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(uVar7,uVar5);
  uVar5 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::m + 8),(unit_data *)(units::precise::m + 8));
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(uint)uVar5
  ;
  local_e0 = (undefined1  [8])&DAT_3ff0000000000000;
  bVar4 = units::precise_unit::operator==((precise_unit *)local_a8,(precise_unit *)local_e0);
  local_c8[0] = bVar4;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_c8,
               (AssertionResult *)"area.units() == precise::m * precise::m","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x221,(char *)local_a8);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
    }
    if (local_e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e0 + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  local_88._8_4_ = SUB84((double)local_58._8_8_ * (double)local_78._8_8_,0);
  local_88._0_8_ = (double)local_58._0_8_ * (double)local_78._0_8_;
  local_88._12_4_ = (int)((ulong)((double)local_58._8_8_ * (double)local_78._8_8_) >> 0x20);
  uVar5 = units::detail::unit_data::operator*((unit_data *)&uStack_48,(unit_data *)&uStack_68);
  local_98._M_allocated_capacity = CONCAT44(uStack_68._4_4_ | uStack_48._4_4_,uVar5);
  local_a8 = (undefined1  [8])local_88._0_8_;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_;
  local_88._8_4_ = SUB84((double)local_78._8_8_ * (double)local_58._8_8_,0);
  local_88._0_8_ = (double)local_78._0_8_ * (double)local_58._0_8_;
  local_88._12_4_ = (int)((ulong)((double)local_78._8_8_ * (double)local_58._8_8_) >> 0x20);
  local_b8._0_4_ =
       units::detail::unit_data::operator*((unit_data *)&uStack_68,(unit_data *)&uStack_48);
  local_b8._4_4_ = uStack_48._4_4_ | uStack_68._4_4_;
  local_c8 = (undefined1  [8])local_88._0_8_;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_;
  bVar4 = units::precise_measurement::operator==
                    ((precise_measurement *)local_a8,(precise_measurement *)local_c8);
  local_e0[0] = bVar4;
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_e0,(AssertionResult *)"d1 * d2 == d2 * d1",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x223,(char *)local_a8);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
    }
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
  }
  desired_units_00 = (precise_unit *)(local_58 + 8);
  local_88._0_8_ = local_58._0_8_;
  dVar1 = units::precise_measurement::value_as((precise_measurement *)local_78,desired_units_00);
  dVar3 = uStack_48;
  local_c8 = (undefined1  [8])(dVar1 + (double)local_88._0_8_);
  local_88._0_8_ = local_58._8_8_;
  local_e0 = (undefined1  [8])&DAT_405f000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_a8,"sum.value()","45.0 + 79.0",(double *)local_c8,(double *)local_e0)
  ;
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x226,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_a0,pbStack_a0);
  }
  local_a8 = (undefined1  [8])local_88._0_8_;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dVar3;
  bVar4 = units::precise_unit::operator==
                    ((precise_unit *)local_a8,(precise_unit *)units::precise::m);
  local_c8[0] = bVar4;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_c8,
               (AssertionResult *)"sum.units() == precise::m","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x227,(char *)local_a8);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
    }
    if (local_e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e0 + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  desired_units = (precise_unit *)(local_78 + 8);
  local_88._0_8_ = local_58._0_8_;
  dVar1 = units::precise_measurement::value_as((precise_measurement *)local_78,desired_units_00);
  local_a8 = (undefined1  [8])(dVar1 + (double)local_88._0_8_);
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._8_8_;
  local_98._M_allocated_capacity = (size_type)uStack_48;
  local_88._0_8_ = local_78._0_8_;
  dVar1 = units::precise_measurement::value_as((precise_measurement *)local_58,desired_units);
  local_c8 = (undefined1  [8])(dVar1 + (double)local_88._0_8_);
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._8_8_;
  local_b8 = uStack_68;
  bVar4 = units::precise_measurement::operator==
                    ((precise_measurement *)local_a8,(precise_measurement *)local_c8);
  local_e0[0] = bVar4;
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_e0,(AssertionResult *)"d1 + d2 == d2 + d1",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x228,(char *)local_a8);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
    }
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
  }
  local_88._0_8_ = local_78._0_8_;
  dVar1 = units::precise_measurement::value_as((precise_measurement *)local_58,desired_units);
  pbVar2 = uStack_68;
  local_c8 = (undefined1  [8])((double)local_88._0_8_ - dVar1);
  local_88._0_8_ = local_78._8_8_;
  local_e0 = (undefined1  [8])&DAT_4041000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_a8,"diff.value()","79.0 - 45",(double *)local_c8,(double *)local_e0);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x22b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_a0,pbStack_a0);
  }
  local_a8 = (undefined1  [8])local_88._0_8_;
  pbStack_a0 = pbVar2;
  bVar4 = units::precise_unit::operator==
                    ((precise_unit *)local_a8,(precise_unit *)units::precise::m);
  local_c8[0] = bVar4;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_c8,
               (AssertionResult *)"diff.units() == precise::m","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x22c,(char *)local_a8);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
    }
    if (local_e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e0 + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  local_88._0_8_ = (double)local_58._0_8_ / (double)local_78._0_8_;
  pVar8 = units::precise_unit::operator/(desired_units_00,desired_units);
  local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pVar8.multiplier_;
  local_c8 = (undefined1  [8])local_88._0_8_;
  local_e0 = (undefined1  [8])&DAT_3fe23a5440cf6475;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_a8,"rat.value()","45.0 / 79",(double *)local_c8,(double *)local_e0);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x22f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e0);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_a0,pbStack_a0);
  }
  local_a8 = (undefined1  [8])local_38;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVar8._8_8_;
  bVar4 = units::precise_unit::operator==((precise_unit *)local_a8,(unit *)&units::ratio);
  local_c8[0] = bVar4;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_c8,(AssertionResult *)"rat.units() == ratio",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x230,(char *)local_a8);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
    }
    if (local_e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e0 + 8))();
    }
    if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_c0,pbStack_c0);
    }
  }
  return;
}

Assistant:

TEST(PreciseMeasurement, helpConstructors)
{
    auto d1 = 45.0 * precise::m;
    auto d2 = precise::m * 79.0;

    static_assert(
        std::is_same<decltype(d1), decltype(d2)>::value,
        "Types are not producing same measurement type");

    auto area = d1 * d2;
    EXPECT_EQ(area.value(), 45.0 * 79);
    EXPECT_TRUE(area.units() == precise::m * precise::m);

    EXPECT_TRUE(d1 * d2 == d2 * d1);

    auto sum = d1 + d2;
    EXPECT_EQ(sum.value(), 45.0 + 79.0);
    EXPECT_TRUE(sum.units() == precise::m);
    EXPECT_TRUE(d1 + d2 == d2 + d1);

    auto diff = d2 - d1;
    EXPECT_EQ(diff.value(), 79.0 - 45);
    EXPECT_TRUE(diff.units() == precise::m);

    auto rat = d1 / d2;
    EXPECT_EQ(rat.value(), 45.0 / 79);
    EXPECT_TRUE(rat.units() == ratio);
}